

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Material.cpp
# Opt level: O0

void __thiscall Assimp::AMFImporter::ParseNode_Color(AMFImporter *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CAMFImporter_NodeElement_Color *this_00;
  DeadlyImportError *this_01;
  float fVar5;
  allocator<char> local_301;
  string local_300;
  allocator<char> local_2d9;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  byte local_85;
  undefined4 local_84;
  bool close_found;
  CAMFImporter_NodeElement_Color *pCStack_80;
  bool read_flag [4];
  CAMFImporter_NodeElement_Color *als;
  undefined1 local_70 [8];
  string an;
  uint local_3c;
  int idx_end;
  int idx;
  CAMFImporter_NodeElement *ne;
  string profile;
  AMFImporter *this_local;
  
  profile.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)&ne);
  local_3c = 0;
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[4])();
  for (; (int)local_3c < iVar2; local_3c = local_3c + 1) {
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[5])(this->mReader,(ulong)local_3c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_70,(char *)CONCAT44(extraout_var,iVar3),
               (allocator<char> *)((long)&als + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&als + 7));
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_70,"profile");
    if (bVar1) {
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)local_3c);
      std::__cxx11::string::operator=((string *)&ne,(char *)CONCAT44(extraout_var_00,iVar3));
      als._0_4_ = 4;
    }
    else {
      Throw_IncorrectAttr(this,(string *)local_70);
      als._0_4_ = 0;
    }
    std::__cxx11::string::~string((string *)local_70);
  }
  this_00 = (CAMFImporter_NodeElement_Color *)operator_new(0x108);
  CAMFImporter_NodeElement_Color::CAMFImporter_NodeElement_Color(this_00,this->mNodeElement_Cur);
  pCStack_80 = this_00;
  _idx_end = this_00;
  std::__cxx11::string::operator=((string *)&this_00->Profile,(string *)&ne);
  uVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((uVar4 & 1) == 0) {
    local_84 = 0;
    ParseHelper_Node_Enter(this,&_idx_end->super_CAMFImporter_NodeElement);
    local_85 = 0;
    do {
      do {
        while( true ) {
          uVar4 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          if ((uVar4 & 1) == 0) goto LAB_005e8399;
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar2 != 1) break;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"r",&local_a9);
          bVar1 = XML_CheckNode_NameEqual(this,&local_a8);
          std::__cxx11::string::~string((string *)&local_a8);
          std::allocator<char>::~allocator(&local_a9);
          if (bVar1) {
            if ((local_84 & 1) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"r",&local_d1);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_f8,"Only one component can be defined.",&local_f9);
              Throw_MoreThanOnceDefined(this,&local_d0,&local_f8);
              std::__cxx11::string::~string((string *)&local_f8);
              std::allocator<char>::~allocator(&local_f9);
              std::__cxx11::string::~string((string *)&local_d0);
              std::allocator<char>::~allocator(&local_d1);
            }
            fVar5 = XML_ReadNode_GetVal_AsFloat(this);
            (pCStack_80->Color).r = fVar5;
            local_84 = CONCAT31(local_84._1_3_,1);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"g",&local_121);
            bVar1 = XML_CheckNode_NameEqual(this,&local_120);
            std::__cxx11::string::~string((string *)&local_120);
            std::allocator<char>::~allocator(&local_121);
            if (bVar1) {
              if ((local_84 & 0x100) != 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_148,"g",&local_149);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_170,"Only one component can be defined.",&local_171);
                Throw_MoreThanOnceDefined(this,&local_148,&local_170);
                std::__cxx11::string::~string((string *)&local_170);
                std::allocator<char>::~allocator(&local_171);
                std::__cxx11::string::~string((string *)&local_148);
                std::allocator<char>::~allocator(&local_149);
              }
              fVar5 = XML_ReadNode_GetVal_AsFloat(this);
              (pCStack_80->Color).g = fVar5;
              local_84._0_2_ = CONCAT11(1,(undefined1)local_84);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_198,"b",&local_199);
              bVar1 = XML_CheckNode_NameEqual(this,&local_198);
              std::__cxx11::string::~string((string *)&local_198);
              std::allocator<char>::~allocator(&local_199);
              if (bVar1) {
                if ((local_84 & 0x10000) != 0) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_1c0,"b",&local_1c1);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_1e8,"Only one component can be defined.",&local_1e9);
                  Throw_MoreThanOnceDefined(this,&local_1c0,&local_1e8);
                  std::__cxx11::string::~string((string *)&local_1e8);
                  std::allocator<char>::~allocator(&local_1e9);
                  std::__cxx11::string::~string((string *)&local_1c0);
                  std::allocator<char>::~allocator(&local_1c1);
                }
                fVar5 = XML_ReadNode_GetVal_AsFloat(this);
                (pCStack_80->Color).b = fVar5;
                local_84._0_3_ = CONCAT12(1,(undefined2)local_84);
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_210,"a",&local_211);
                bVar1 = XML_CheckNode_NameEqual(this,&local_210);
                std::__cxx11::string::~string((string *)&local_210);
                std::allocator<char>::~allocator(&local_211);
                if (bVar1) {
                  if ((local_84 & 0x1000000) != 0) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_238,"a",&local_239);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_260,"Only one component can be defined.",&local_261)
                    ;
                    Throw_MoreThanOnceDefined(this,&local_238,&local_260);
                    std::__cxx11::string::~string((string *)&local_260);
                    std::allocator<char>::~allocator(&local_261);
                    std::__cxx11::string::~string((string *)&local_238);
                    std::allocator<char>::~allocator(&local_239);
                  }
                  fVar5 = XML_ReadNode_GetVal_AsFloat(this);
                  (pCStack_80->Color).a = fVar5;
                  local_84 = CONCAT13(1,(undefined3)local_84);
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_288,"color",&local_289);
                  XML_CheckNode_SkipUnsupported(this,&local_288);
                  std::__cxx11::string::~string((string *)&local_288);
                  std::allocator<char>::~allocator(&local_289);
                }
              }
            }
          }
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar2 != 2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"color",&local_2b1);
      bVar1 = XML_CheckNode_NameEqual(this,&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::allocator<char>::~allocator(&local_2b1);
    } while (!bVar1);
    local_85 = 1;
LAB_005e8399:
    if ((local_85 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"color",&local_2d9);
      Throw_CloseNotFound(this,&local_2d8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::allocator<char>::~allocator(&local_2d9);
    }
    ParseHelper_Node_Exit(this);
    if ((((local_84 & 1) == 0) || ((local_84 & 0x100) == 0)) || ((local_84 & 0x10000) == 0)) {
      this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_300,"Not all color components are defined.",&local_301);
      DeadlyImportError::DeadlyImportError(this_01,&local_300);
      __cxa_throw(this_01,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    if ((local_84 & 0x1000000) == 0) {
      (pCStack_80->Color).a = 1.0;
    }
  }
  else {
    std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
    push_back(&this->mNodeElement_Cur->Child,(value_type *)&idx_end);
  }
  pCStack_80->Composed = false;
  std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
  push_back(&this->mNodeElement_List,(value_type *)&idx_end);
  std::__cxx11::string::~string((string *)&ne);
  return;
}

Assistant:

void AMFImporter::ParseNode_Color() {
    std::string profile;
    CAMFImporter_NodeElement* ne;

	// Read attributes for node <color>.
	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECK_RET("profile", profile, mReader->getAttributeValue);
	MACRO_ATTRREAD_LOOPEND;

	// create new color object.
	ne = new CAMFImporter_NodeElement_Color(mNodeElement_Cur);

	CAMFImporter_NodeElement_Color& als = *((CAMFImporter_NodeElement_Color*)ne);// alias for convenience

	als.Profile = profile;
	// Check for child nodes
	if(!mReader->isEmptyElement())
	{
		bool read_flag[4] = { false, false, false, false };

		ParseHelper_Node_Enter(ne);
		MACRO_NODECHECK_LOOPBEGIN("color");
			MACRO_NODECHECK_READCOMP_F("r", read_flag[0], als.Color.r);
			MACRO_NODECHECK_READCOMP_F("g", read_flag[1], als.Color.g);
			MACRO_NODECHECK_READCOMP_F("b", read_flag[2], als.Color.b);
			MACRO_NODECHECK_READCOMP_F("a", read_flag[3], als.Color.a);
		MACRO_NODECHECK_LOOPEND("color");
		ParseHelper_Node_Exit();
		// check that all components was defined
        if (!(read_flag[0] && read_flag[1] && read_flag[2])) {
            throw DeadlyImportError("Not all color components are defined.");
        }

        // check if <a> is absent. Then manually add "a == 1".
        if (!read_flag[3]) {
            als.Color.a = 1;
        }
	}
	else
	{
		mNodeElement_Cur->Child.push_back(ne);// Add element to child list of current element
	}

	als.Composed = false;
	mNodeElement_List.push_back(ne);// and to node element list because its a new object in graph.
}